

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O2

void sortSetData(HighsInt num_entries,vector<int,_std::allocator<int>_> *set,HighsVarType *data0,
                HighsVarType *sorted_data0)

{
  pointer piVar1;
  ulong uVar2;
  vector<int,_std::allocator<int>_> perm_vec;
  vector<int,_std::allocator<int>_> sort_set_vec;
  allocator_type local_61;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  if (0 < num_entries) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,(ulong)(num_entries + 1),
               (allocator_type *)&local_60);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_60,(ulong)(num_entries + 1),&local_61);
    piVar1 = (set->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    for (uVar2 = 0; (uint)num_entries != uVar2; uVar2 = uVar2 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[uVar2 + 1] = piVar1[uVar2];
      local_60._M_impl.super__Vector_impl_data._M_start[uVar2 + 1] = (HighsInt)uVar2;
    }
    maxheapsort(local_48._M_impl.super__Vector_impl_data._M_start,
                local_60._M_impl.super__Vector_impl_data._M_start,num_entries);
    piVar1 = (set->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    for (uVar2 = 0; (uint)num_entries != uVar2; uVar2 = uVar2 + 1) {
      piVar1[uVar2] = local_48._M_impl.super__Vector_impl_data._M_start[uVar2 + 1];
      if (data0 != (HighsVarType *)0x0) {
        sorted_data0[uVar2] = data0[local_60._M_impl.super__Vector_impl_data._M_start[uVar2 + 1]];
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void sortSetData(const HighsInt num_entries, vector<HighsInt>& set,
                 const HighsVarType* data0, HighsVarType* sorted_data0) {
  if (num_entries <= 0) return;
  vector<HighsInt> sort_set_vec(1 + num_entries);
  vector<HighsInt> perm_vec(1 + num_entries);

  HighsInt* sort_set = sort_set_vec.data();
  HighsInt* perm = perm_vec.data();

  for (HighsInt ix = 0; ix < num_entries; ix++) {
    sort_set[1 + ix] = set[ix];
    perm[1 + ix] = ix;
  }
  maxheapsort(sort_set, perm, num_entries);
  for (HighsInt ix = 0; ix < num_entries; ix++) {
    set[ix] = sort_set[1 + ix];
    if (data0 != NULL) sorted_data0[ix] = data0[perm[1 + ix]];
  }
}